

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

Status __thiscall google::protobuf::File::RecursivelyCreateDir(File *this,string *path,int mode)

{
  bool bVar1;
  long lVar2;
  string_view message;
  string_view message_00;
  string local_48;
  
  CreateDir((File *)&local_48,path,mode);
  absl::lts_20250127::Status::~Status((Status *)&local_48);
  if (local_48._M_dataplus._M_p == (pointer)0x1) {
    *(undefined8 *)this = 1;
  }
  else {
    bVar1 = Exists(path);
    if (bVar1) {
      message._M_str = &DAT_00000013;
      message._M_len = (size_t)this;
      absl::lts_20250127::AlreadyExistsError(message);
    }
    else {
      lVar2 = std::__cxx11::string::rfind((char)path,0x2f);
      if (lVar2 == -1) {
        message_00._M_str = (char *)0xf;
        message_00._M_len = (size_t)this;
        absl::lts_20250127::FailedPreconditionError(message_00);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_48,(ulong)path);
        RecursivelyCreateDir(this,&local_48,mode);
        std::__cxx11::string::~string((string *)&local_48);
        if (*(long *)this == 1) {
          absl::lts_20250127::Status::~Status((Status *)this);
          CreateDir(this,path,mode);
        }
      }
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status File::RecursivelyCreateDir(const std::string& path, int mode) {
  if (CreateDir(path, mode).ok()) return absl::OkStatus();

  if (Exists(path)) return absl::AlreadyExistsError("Path already exists");

  // Try creating the parent.
  std::string::size_type slashpos = path.find_last_of('/');
  if (slashpos == std::string::npos) {
    return absl::FailedPreconditionError("No parent given");
  }

  RETURN_IF_ERROR(RecursivelyCreateDir(path.substr(0, slashpos), mode));
  return CreateDir(path, mode);
}